

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O3

bool check_avoid(CHAR_DATA *ch,CHAR_DATA *victim,int dt)

{
  short sVar1;
  bool bVar2;
  short sVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  float fVar11;
  float fVar12;
  char buf1 [4608];
  char buf2 [4608];
  float local_243c;
  char local_2438 [4608];
  char local_1238 [4616];
  
  bVar2 = is_awake(victim);
  if (!bVar2) {
    return false;
  }
  iVar4 = get_skill(ch,(int)gsn_avoid);
  if (iVar4 == 0) {
    return false;
  }
  iVar4 = get_skill(victim,(int)gsn_avoid);
  fVar11 = (float)((iVar4 * 3) / 10);
  uVar5 = get_curr_stat(victim,3);
  iVar4 = get_curr_stat(ch,3);
  if ((int)uVar5 < 6) goto LAB_002905a5;
  if (uVar5 < 0xb) {
    fVar12 = (float)(uVar5 >> 1);
  }
  else {
    if (uVar5 < 0x10) {
      uVar7 = (uVar5 * 2 & 0xff) * 0x56 >> 8;
    }
    else {
      if (0x14 < uVar5) {
        fVar12 = (float)(int)uVar5;
        goto LAB_002905a1;
      }
      uVar7 = (uVar5 * 8 & 0xff) / 10;
    }
    fVar12 = (float)uVar7;
  }
LAB_002905a1:
  fVar11 = fVar11 + fVar12;
LAB_002905a5:
  local_243c = (float)(((int)ch->size - (int)victim->size) * 5) +
               (float)(int)(uVar5 - iVar4) + fVar11;
  bVar2 = is_affected_room(ch->in_room,(int)gsn_blanket);
  if (bVar2) {
    local_243c = local_243c * 0.8;
  }
  bVar2 = is_npc(ch);
  if (((!bVar2) && (iVar4 = check_posture(ch), iVar4 == -1)) &&
     (bVar2 = style_check((int)gsn_posture,(int)ch->pcdata->style), bVar2)) {
    local_243c = local_243c + 20.0;
  }
  bVar2 = is_npc(victim);
  if (!bVar2) {
    iVar4 = check_posture(victim);
    if ((iVar4 == -1) && (bVar2 = style_check((int)gsn_posture,(int)victim->pcdata->style), bVar2))
    {
      local_243c = local_243c + 20.0;
    }
    iVar4 = check_posture(victim);
    if ((iVar4 == 1) && (bVar2 = style_check((int)gsn_posture,(int)victim->pcdata->style), bVar2)) {
      local_243c = local_243c + -20.0;
    }
  }
  bVar2 = check_entwine(victim,2);
  if (bVar2) {
    local_243c = local_243c * 0.5;
  }
  bVar2 = is_affected(victim,(int)gsn_creeping_tomb);
  if (bVar2) {
    local_243c = local_243c * 0.75;
  }
  bVar2 = is_shifted(victim);
  if (bVar2) {
    iVar4 = get_curr_stat(victim,3);
    local_243c = (float)iVar4 * 2.5;
    bVar2 = is_affected_by(victim,0x15);
    if (bVar2) {
      local_243c = local_243c * 1.1;
    }
    bVar2 = is_affected_by(victim,0x1d);
    if (bVar2) {
      local_243c = local_243c * 0.65;
    }
  }
  sVar1 = ch->defense_mod;
  sVar3 = get_hitroll(ch);
  local_243c = ((float)(int)sVar3 / -250.0 + 1.0) * ((float)(int)sVar1 + local_243c);
  bVar2 = is_npc(victim);
  if (!bVar2) {
    iVar4 = armor_weight(victim);
    iVar6 = get_curr_stat(victim,0);
    local_243c = local_243c * ((float)((iVar6 * 10 - iVar4) + 0x78) / 250.0);
    if (local_243c < 0.0) {
      local_243c = 0.0;
    }
  }
  bVar2 = is_npc(victim);
  if ((bVar2) || (bVar2 = is_npc(ch), bVar2)) {
    local_243c = local_243c + (float)((int)victim->level - (int)ch->level);
  }
  uVar7 = (int)ch->size - (int)victim->size;
  uVar5 = -uVar7;
  if (0 < (int)uVar7) {
    uVar5 = uVar7;
  }
  fVar11 = ((float)(int)ch->balance +
           ((local_243c - (float)((uVar5 & 0xffff) * 5)) - (float)(int)victim->balance)) -
           (float)ch->analyze;
  if (victim->analyzePC == ch) {
    fVar11 = fVar11 + (float)victim->analyze;
  }
  bVar2 = is_npc(victim);
  if ((!bVar2) && (bVar2 = style_check((int)gsn_evasion,(int)victim->pcdata->style), bVar2)) {
    iVar4 = check_evasion(victim,(int)fVar11);
    fVar11 = fVar11 + (float)iVar4;
  }
  fVar12 = 75.0;
  if (fVar11 <= 75.0) {
    fVar12 = fVar11;
  }
  iVar4 = number_percent();
  if (fVar12 <= (float)iVar4) {
    return false;
  }
  pcVar8 = get_attack_noun(ch,dt);
  pcVar9 = "barely ";
  if (0xe < (int)fVar12 - iVar4) {
    pcVar9 = "";
  }
  pcVar10 = " with ease";
  if ((int)fVar12 - iVar4 < 0x33) {
    pcVar10 = "";
  }
  sprintf(local_2438,"You %savoid $n\'s %s%s.",pcVar9,pcVar8,pcVar10);
  sprintf(local_1238,"$N %savoids your %s%s.",pcVar9,pcVar8,pcVar10);
  act(local_2438,ch,(void *)0x0,victim,2);
  act(local_1238,ch,(void *)0x0,victim,3);
  check_improve(victim,(int)gsn_avoid,true,5);
  return true;
}

Assistant:

bool check_avoid(CHAR_DATA *ch, CHAR_DATA *victim, int dt)
{
	float chance;
	char buf1[MAX_STRING_LENGTH], buf2[MAX_STRING_LENGTH];
	char *attack;
	int dex, dexa, str;
	int encumb;
	int roll, diff;

	if (!is_awake(victim))
		return false;

	if (get_skill(ch, gsn_avoid) == 0)
		return false;

	chance = (3 * get_skill(victim, gsn_avoid) / 10);

	dex = get_curr_stat(victim, STAT_DEX);
	dexa = get_curr_stat(ch, STAT_DEX);

	if (dex <= 5)
		chance += 0;
	else if (dex <= 10)
		chance += dex / 2;
	else if (dex <= 15)
		chance += (2 * dex / 3);
	else if (dex <= 20)
		chance += (8 * dex / 10);
	else
		chance += dex;

	chance += dex - dexa;
	chance += (ch->size - victim->size) * 5;

	if (is_affected_room(ch->in_room, gsn_blanket))
		chance *= 0.8;

	/* posture */
	if (!is_npc(ch))
	{
		if (check_posture(ch) == POSTURE_DEFENSE && style_check(gsn_posture, ch->pcdata->style))
			chance += 20;
	}

	if (!is_npc(victim))
	{
		if (check_posture(victim) == POSTURE_DEFENSE && style_check(gsn_posture, victim->pcdata->style))
			chance += 20;

		if (check_posture(victim) == POSTURE_OFFENSE && style_check(gsn_posture, victim->pcdata->style))
			chance -= 20;
	}

	if (check_entwine(victim, 2))
		chance /= 2;

	if (is_affected(victim, gsn_creeping_tomb))
		chance *= 0.75;

	if (is_shifted(victim))
	{
		chance = get_curr_stat(victim, STAT_DEX) * 2.5;

		if (is_affected_by(victim, AFF_HASTE))
			chance *= 1.1;

		if (is_affected_by(victim, AFF_SLOW))
			chance *= .65;
	}

	chance += ch->defense_mod;
	chance *= (1 - ((float)get_hitroll(ch) / (float)250));

	if (!is_npc(victim))
	{
		encumb = armor_weight(victim);
		str = get_curr_stat(victim, STAT_STR);
		chance *= (float)(300 + (10 * (str - 18)) - encumb) / (float)250;

		if (chance < 0)
			chance = 0;
	}

	if (is_npc(victim) || is_npc(ch))
		chance += (victim->level - ch->level);

	chance -= 5 * abs((ch->size - victim->size));
	chance -= victim->balance;
	chance += ch->balance;

	chance -= ch->analyze;

	if (victim->analyzePC == ch)
		chance += victim->analyze;

	if (!is_npc(victim))
	{
		if (style_check(gsn_evasion, victim->pcdata->style))
			chance += check_evasion(victim, (int)chance);
	}

	chance = std::min(chance, (float)75);

	roll = number_percent();

	if (roll >= chance)
		return false;

	diff = (int)chance - roll;

	attack = get_dam_message(ch, dt);

	sprintf(buf1, "You %savoid $n's %s%s.", (diff < 15) ? "barely " : "", attack, (diff > 50) ? " with ease" : "");
	sprintf(buf2, "$N %savoids your %s%s.", (diff < 15) ? "barely " : "", attack, (diff > 50) ? " with ease" : "");

	act(buf1, ch, 0, victim, TO_VICT);
	act(buf2, ch, 0, victim, TO_CHAR);

	check_improve(victim, gsn_avoid, true, 5);

	return true;
}